

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_499f32::CCoinsViewCacheTest::SelfTest
          (CCoinsViewCacheTest *this,bool sanity_check)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  size_t *psVar5;
  __node_base *p_Var6;
  long lVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  size_t local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined1 *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  long local_48;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = memusage::
          DynamicUsage<COutPoint,CCoinsCacheEntry,SaltedOutpointHasher,std::equal_to<COutPoint>,144ul,8ul>
                    (&(this->super_CCoinsViewCache).cacheCoins);
  p_Var6 = &(this->super_CCoinsViewCache).cacheCoins._M_h._M_before_begin;
  lVar7 = 0;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    sVar3 = Coin::DynamicMemoryUsage((Coin *)(p_Var6 + 9));
    sVar2 = sVar2 + sVar3;
    lVar7 = lVar7 + 1;
  }
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5f;
  file.m_begin = (iterator)&local_58;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  local_48 = lVar7;
  local_40 = sVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_68,msg);
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = "";
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_90 = "";
  uVar1 = CCoinsViewCache::GetCacheSize(&this->super_CCoinsViewCache);
  psVar5 = &local_d0;
  local_d0 = CONCAT44(local_d0._4_4_,uVar1);
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_long>
            (&local_88,&local_98,0x5f,1,2,psVar5,"GetCacheSize()",&local_48,"count");
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x60;
  file_00.m_begin = (iterator)&local_a8;
  msg_00.m_end = (iterator)psVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = "";
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
  local_c0 = "";
  local_d0 = CCoinsViewCache::DynamicMemoryUsage(&this->super_CCoinsViewCache);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_88,&local_c8,0x60,1,2,&local_d0,"DynamicMemoryUsage()",&local_40,"ret");
  if (sanity_check) {
    CCoinsViewCache::SanityCheck(&this->super_CCoinsViewCache);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelfTest(bool sanity_check = true) const
    {
        // Manually recompute the dynamic usage of the whole data, and compare it.
        size_t ret = memusage::DynamicUsage(cacheCoins);
        size_t count = 0;
        for (const auto& entry : cacheCoins) {
            ret += entry.second.coin.DynamicMemoryUsage();
            ++count;
        }
        BOOST_CHECK_EQUAL(GetCacheSize(), count);
        BOOST_CHECK_EQUAL(DynamicMemoryUsage(), ret);
        if (sanity_check) {
            SanityCheck();
        }
    }